

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cpp
# Opt level: O0

bool spvtools::opt::ExtInsMatch
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices,Instruction *insInst
               ,uint32_t extOffset)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint local_2c;
  uint32_t i;
  uint32_t numIndices;
  uint32_t extOffset_local;
  Instruction *insInst_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices_local;
  
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(extIndices);
  uVar1 = (int)sVar4 - extOffset;
  uVar2 = Instruction::NumInOperands(insInst);
  if (uVar1 == uVar2 - 2) {
    for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (extIndices,(ulong)(local_2c + extOffset));
      uVar2 = *pvVar5;
      uVar3 = Instruction::GetSingleWordInOperand(insInst,local_2c + 2);
      if (uVar2 != uVar3) {
        return false;
      }
    }
    extIndices_local._7_1_ = true;
  }
  else {
    extIndices_local._7_1_ = false;
  }
  return extIndices_local._7_1_;
}

Assistant:

bool ExtInsMatch(const std::vector<uint32_t>& extIndices,
                 const Instruction* insInst, const uint32_t extOffset) {
  uint32_t numIndices = static_cast<uint32_t>(extIndices.size()) - extOffset;
  if (numIndices != insInst->NumInOperands() - 2) return false;
  for (uint32_t i = 0; i < numIndices; ++i)
    if (extIndices[i + extOffset] != insInst->GetSingleWordInOperand(i + 2))
      return false;
  return true;
}